

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_scale(Integer s_a,void *scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  double *in_RSI;
  long in_RDI;
  Integer _i_6;
  double _ip_1;
  double _rp_1;
  double _ival_1;
  double _rval_1;
  double *_ptr_6;
  Integer _i_5;
  float _ip;
  float _rp;
  float _ival;
  float _rval;
  float *_ptr_5;
  Integer _i_4;
  double _sval_4;
  double *_ptr_4;
  Integer _i_3;
  float _sval_3;
  float *_ptr_3;
  Integer _i_2;
  longlong _sval_2;
  longlong *_ptr_2;
  Integer _i_1;
  long _sval_1;
  long *_ptr_1;
  Integer _i;
  int _sval;
  int *_ptr;
  void *vptr;
  Integer me;
  Integer ld;
  Integer s_hi;
  Integer s_lo;
  int local_sync_end;
  int local_sync_begin;
  Integer hdl_a;
  Integer *in_stack_000001f8;
  Integer *in_stack_00000200;
  Integer in_stack_00000208;
  Integer in_stack_00000210;
  Integer *in_stack_000002d0;
  void *in_stack_000002d8;
  Integer *in_stack_000002e0;
  Integer *in_stack_000002e8;
  Integer in_stack_000002f0;
  long in_stack_fffffffffffffef0;
  long local_e0;
  long local_c0;
  long local_a8;
  long local_90;
  long local_78;
  long local_60;
  long local_48;
  long local_30;
  long local_28;
  
  lVar11 = in_RDI + 1000;
  pnga_pgroup_nodeid(SPA[lVar11].grp);
  iVar10 = _ga_sync_end;
  iVar9 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar9 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffef0);
  }
  pnga_distribution(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  pnga_access_ptr(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
                  in_stack_000002d0);
  if (SPA[lVar11].type == 0x3e9) {
    fVar7 = *(float *)in_RSI;
    for (local_60 = local_28; local_60 <= local_30; local_60 = local_60 + 1) {
      *(int *)(local_48 + (local_60 - local_28) * 4) =
           *(int *)(local_48 + (local_60 - local_28) * 4) * (int)fVar7;
    }
  }
  else if (SPA[lVar11].type == 0x3ea) {
    dVar8 = *in_RSI;
    for (local_78 = local_28; local_78 <= local_30; local_78 = local_78 + 1) {
      *(long *)(local_48 + (local_78 - local_28) * 8) =
           *(long *)(local_48 + (local_78 - local_28) * 8) * (long)dVar8;
    }
  }
  else if (SPA[lVar11].type == 0x3f8) {
    dVar8 = *in_RSI;
    for (local_90 = local_28; local_90 <= local_30; local_90 = local_90 + 1) {
      *(long *)(local_48 + (local_90 - local_28) * 8) =
           *(long *)(local_48 + (local_90 - local_28) * 8) * (long)dVar8;
    }
  }
  else if (SPA[lVar11].type == 0x3eb) {
    fVar7 = *(float *)in_RSI;
    for (local_a8 = local_28; local_a8 <= local_30; local_a8 = local_a8 + 1) {
      *(float *)(local_48 + (local_a8 - local_28) * 4) =
           *(float *)(local_48 + (local_a8 - local_28) * 4) * fVar7;
    }
  }
  else if (SPA[lVar11].type == 0x3ec) {
    dVar8 = *in_RSI;
    for (local_c0 = local_28; local_c0 <= local_30; local_c0 = local_c0 + 1) {
      *(double *)(local_48 + (local_c0 - local_28) * 8) =
           *(double *)(local_48 + (local_c0 - local_28) * 8) * dVar8;
    }
  }
  else if (SPA[lVar11].type == 0x3ee) {
    fVar7 = *(float *)in_RSI;
    fVar1 = *(float *)((long)in_RSI + 4);
    for (local_e0 = local_28; local_e0 <= local_30; local_e0 = local_e0 + 1) {
      fVar2 = *(float *)(local_48 + (local_e0 - local_28) * 8);
      fVar3 = *(float *)(local_48 + 4 + (local_e0 - local_28) * 8);
      *(float *)(local_48 + (local_e0 - local_28) * 8) = fVar7 * fVar2 + -(fVar1 * fVar3);
      *(float *)(local_48 + 4 + (local_e0 - local_28) * 8) = fVar7 * fVar3 + fVar1 * fVar2;
    }
  }
  else if (SPA[lVar11].type == 0x3ef) {
    dVar8 = *in_RSI;
    dVar4 = in_RSI[1];
    for (in_stack_fffffffffffffef0 = local_28; in_stack_fffffffffffffef0 <= local_30;
        in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 + 1) {
      dVar5 = *(double *)(local_48 + (in_stack_fffffffffffffef0 - local_28) * 0x10);
      dVar6 = *(double *)(local_48 + 8 + (in_stack_fffffffffffffef0 - local_28) * 0x10);
      *(double *)(local_48 + (in_stack_fffffffffffffef0 - local_28) * 0x10) =
           dVar8 * dVar5 + -(dVar4 * dVar6);
      *(double *)(local_48 + 8 + (in_stack_fffffffffffffef0 - local_28) * 0x10) =
           dVar8 * dVar6 + dVar4 * dVar5;
    }
  }
  if (iVar10 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void pnga_sprs_array_scale(Integer s_a, void *scale)
{
  Integer hdl_a = s_a+GA_OFFSET;
  int local_sync_begin,local_sync_end;
  Integer s_lo, s_hi;
  Integer ld;
  Integer me = pnga_pgroup_nodeid(SPA[hdl_a].grp);
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_a].grp);
  pnga_distribution(SPA[hdl_a].g_data,me,&s_lo,&s_hi);
  pnga_access_ptr(SPA[hdl_a].g_data,&s_lo,&s_hi,&vptr,&ld);
  if (SPA[hdl_a].type == C_INT) {
    SPRS_REAL_SCALE_M(int,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_LONG) {
    SPRS_REAL_SCALE_M(long,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_LONGLONG) {
    SPRS_REAL_SCALE_M(long long,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_FLOAT) {
    SPRS_REAL_SCALE_M(float,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_DBL) {
    SPRS_REAL_SCALE_M(double,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_SCPL) {
    SPRS_COMPLEX_SCALE_M(float,vptr,s_lo,s_hi,scale);
  } else if (SPA[hdl_a].type == C_DCPL) {
    SPRS_COMPLEX_SCALE_M(double,vptr,s_lo,s_hi,scale);
  }

  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_a].grp);
}